

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O1

bool __thiscall Rml::BaseXMLParser::ReadOpenTag(BaseXMLParser *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  iterator iVar5;
  bool parse_inner_xml_as_data;
  XMLAttributes attributes;
  String tag_name;
  bool local_99;
  undefined1 local_98 [40];
  String local_70;
  String local_50;
  
  this->open_tag_depth = this->open_tag_depth + 1;
  if ((this->data)._M_string_length != 0) {
    if (this->inner_xml_data == false) {
      (*this->_vptr_BaseXMLParser[4])(this,&this->data,0);
    }
    (this->data)._M_string_length = 0;
    *(this->data)._M_dataplus._M_p = '\0';
  }
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  bVar3 = FindWord(this,&local_70,"/>");
  if (!bVar3) {
LAB_001e3984:
    bVar3 = false;
    goto LAB_001e39ad;
  }
  bVar3 = PeekString(this,">",true);
  if (bVar3) {
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_98._16_8_ = (pointer)0x0;
    this->line_number_open_tag = this->line_number;
    if (this->inner_xml_data == false) {
      (*this->_vptr_BaseXMLParser[2])(this,&local_70,local_98);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
               *)local_98);
    bVar2 = true;
  }
  else {
    bVar3 = PeekString(this,"/",true);
    if (bVar3) {
      bVar3 = PeekString(this,">",true);
      if (bVar3) {
        local_98._0_8_ = (pointer)0x0;
        local_98._8_8_ = (pointer)0x0;
        local_98._16_8_ = (pointer)0x0;
        this->line_number_open_tag = this->line_number;
        if (this->inner_xml_data == false) {
          (*this->_vptr_BaseXMLParser[2])(this,&local_70,local_98);
        }
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                   *)local_98);
        if (this->inner_xml_data == false) {
          (*this->_vptr_BaseXMLParser[3])(this,&local_70);
        }
        this->open_tag_depth = this->open_tag_depth + -1;
        bVar2 = false;
        goto LAB_001e38bb;
      }
    }
    local_99 = false;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_98._16_8_ = (pointer)0x0;
    bVar4 = ReadAttributes(this,(XMLAttributes *)local_98,&local_99);
    bVar3 = false;
    bVar2 = false;
    if (bVar4) {
      bVar3 = PeekString(this,">",true);
      if (bVar3) {
        this->line_number_open_tag = this->line_number;
        bVar2 = true;
        if (this->inner_xml_data == false) {
          (*this->_vptr_BaseXMLParser[2])(this,&local_70,local_98);
        }
LAB_001e3881:
        bVar3 = true;
        if (((bVar2) && (local_99 == true)) && (this->inner_xml_data == false)) {
          this->inner_xml_data = true;
          this->inner_xml_data_terminate_depth = this->open_tag_depth;
          this->inner_xml_data_index_begin = this->xml_index;
        }
      }
      else {
        bVar4 = PeekString(this,"/",true);
        bVar3 = false;
        bVar2 = false;
        if (bVar4) {
          bVar4 = PeekString(this,">",true);
          bVar3 = false;
          bVar2 = false;
          if (bVar4) {
            this->line_number_open_tag = this->line_number;
            if (this->inner_xml_data == false) {
              (*this->_vptr_BaseXMLParser[2])(this,&local_70,local_98);
            }
            if (this->inner_xml_data == false) {
              (*this->_vptr_BaseXMLParser[3])(this,&local_70);
            }
            this->open_tag_depth = this->open_tag_depth + -1;
            bVar2 = false;
            goto LAB_001e3881;
          }
        }
      }
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
               *)local_98);
    if (!bVar3) goto LAB_001e3984;
  }
LAB_001e38bb:
  if (bVar2) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    StringUtilities::ToLower(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    iVar5 = itlib::
            flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::find<std::__cxx11::string>
                      ((flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&this->cdata_tags,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
    pbVar1 = (this->cdata_tags).m_container.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current == pbVar1) {
LAB_001e3988:
      bVar3 = false;
    }
    else {
      bVar3 = ReadCDATA(this,(char *)local_98._0_8_);
      if (!bVar3) goto LAB_001e3988;
      this->open_tag_depth = this->open_tag_depth + -1;
      if ((this->data)._M_string_length != 0) {
        if (this->inner_xml_data == false) {
          (*this->_vptr_BaseXMLParser[4])(this,&this->data,1);
        }
        (this->data)._M_string_length = 0;
        *(this->data)._M_dataplus._M_p = '\0';
      }
      bVar3 = true;
      if (this->inner_xml_data == false) {
        (*this->_vptr_BaseXMLParser[3])(this,&local_70);
      }
    }
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
    }
    if (iVar5._M_current != pbVar1) goto LAB_001e39ad;
  }
  bVar3 = true;
LAB_001e39ad:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool BaseXMLParser::ReadOpenTag()
{
	// Increase the open depth
	open_tag_depth++;

	// Opening tag; send data immediately and open the tag.
	if (!data.empty())
	{
		HandleDataInternal(data, XMLDataType::Text);
		data.clear();
	}

	String tag_name;
	if (!FindWord(tag_name, "/>"))
		return false;

	bool section_opened = false;

	if (PeekString(">"))
	{
		// Simple open tag.
		HandleElementStartInternal(tag_name, XMLAttributes());
		section_opened = true;
	}
	else if (PeekString("/") && PeekString(">"))
	{
		// Empty open tag.
		HandleElementStartInternal(tag_name, XMLAttributes());
		HandleElementEndInternal(tag_name);

		// Tag immediately closed, reduce count
		open_tag_depth--;
	}
	else
	{
		// It appears we have some attributes. Let's parse them.
		bool parse_inner_xml_as_data = false;
		XMLAttributes attributes;
		if (!ReadAttributes(attributes, parse_inner_xml_as_data))
			return false;

		if (PeekString(">"))
		{
			HandleElementStartInternal(tag_name, attributes);
			section_opened = true;
		}
		else if (PeekString("/") && PeekString(">"))
		{
			HandleElementStartInternal(tag_name, attributes);
			HandleElementEndInternal(tag_name);

			// Tag immediately closed, reduce count
			open_tag_depth--;
		}
		else
		{
			return false;
		}

		if (section_opened && parse_inner_xml_as_data && !inner_xml_data)
		{
			inner_xml_data = true;
			inner_xml_data_terminate_depth = open_tag_depth;
			inner_xml_data_index_begin = xml_index;
		}
	}

	// Check if this tag needs to be processed as CDATA.
	if (section_opened)
	{
		const String lcase_tag_name = StringUtilities::ToLower(tag_name);
		bool is_cdata_tag = (cdata_tags.find(lcase_tag_name) != cdata_tags.end());

		if (is_cdata_tag)
		{
			if (ReadCDATA(lcase_tag_name.c_str()))
			{
				open_tag_depth--;
				if (!data.empty())
				{
					HandleDataInternal(data, XMLDataType::CData);
					data.clear();
				}
				HandleElementEndInternal(tag_name);

				return true;
			}

			return false;
		}
	}

	return true;
}